

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O0

void __thiscall Variation::canonify(Variation *this,NamedDnaSequence *reference,bool rightmost)

{
  char cVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  runtime_error *this_00;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  byte in_DL;
  NamedDnaSequence *in_RSI;
  long in_RDI;
  int j_1;
  int shift_1;
  int j;
  int shift;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  NamedDnaSequence *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  int local_98;
  int local_94;
  string local_90 [32];
  string local_70 [32];
  string local_50 [36];
  int local_2c;
  int local_28;
  byte local_11;
  NamedDnaSequence *local_10;
  
  local_11 = in_DL & 1;
  if (*(int *)(in_RDI + 0x60) != 0) {
    local_10 = in_RSI;
    if (*(int *)(in_RDI + 0x60) == 2) {
      if (local_11 == 0) {
        while (*(long *)(in_RDI + 0x28) != 0) {
          cVar1 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          in_stack_fffffffffffffef0 = (int)cVar1;
          cVar1 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (in_stack_fffffffffffffef0 != cVar1) break;
          *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
          *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
        }
      }
      else {
        while( true ) {
          in_stack_fffffffffffffef8 =
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (in_RDI + 0x30);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   NamedDnaSequence::size(local_10);
          if (pbVar3 <= in_stack_fffffffffffffef8) break;
          cVar1 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          in_stack_fffffffffffffef4 = (int)cVar1;
          cVar1 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (in_stack_fffffffffffffef4 != cVar1) break;
          *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
          *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
        }
      }
    }
    if (*(int *)(in_RDI + 0x60) == 1) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "Variation::canonify is only applicable to insertions if sequence is known");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((local_11 & 1) == 0) {
        for (local_94 = 0; *(long *)(in_RDI + 0x28) != (long)local_94; local_94 = local_94 + 1) {
          pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x40);
          iVar7 = (int)*pcVar6;
          cVar1 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,CONCAT44(iVar7,in_stack_fffffffffffffec0));
          if (iVar7 != cVar1) break;
        }
        if (local_94 != 0) {
          *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - (long)local_94;
          local_98 = (int)((ulong)(long)local_94 % *(ulong *)(in_RDI + 0x30));
          if (local_98 != 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_d8,in_RDI + 0x40U);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_f8,in_RDI + 0x40U);
            std::operator+(in_stack_fffffffffffffef8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_b8);
            std::__cxx11::string::~string(local_b8);
            std::__cxx11::string::~string(local_f8);
            std::__cxx11::string::~string(local_d8);
          }
        }
      }
      else {
        for (local_28 = 0; lVar4 = *(long *)(in_RDI + 0x28), lVar8 = (long)local_28,
            sVar5 = NamedDnaSequence::size(local_10), lVar4 + lVar8 != sVar5;
            local_28 = local_28 + 1) {
          pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI + 0x40);
          cVar1 = *pcVar6;
          cVar2 = NamedDnaSequence::operator[]
                            (in_stack_fffffffffffffec8,
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (cVar1 != cVar2) break;
        }
        if (local_28 != 0) {
          *(long *)(in_RDI + 0x28) = (long)local_28 + *(long *)(in_RDI + 0x28);
          local_2c = (int)((ulong)(long)local_28 % *(ulong *)(in_RDI + 0x30));
          if (local_2c != 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_70,in_RDI + 0x40U);
            std::__cxx11::string::substr((ulong)local_90,in_RDI + 0x40U);
            std::operator+(in_stack_fffffffffffffef8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_50);
            std::__cxx11::string::~string(local_50);
            std::__cxx11::string::~string(local_90);
            std::__cxx11::string::~string(local_70);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Variation::canonify(const NamedDnaSequence* reference, bool rightmost) {
	if (type == NONE) return;
	if (type == DELETION) {
		assert(coord1 < coord2);
		assert(coord2 <= reference->size());
		if (rightmost) {
			while (coord2 < reference->size()) {
				if ((*reference)[coord1] != (*reference)[coord2]) break;
				coord1 += 1;
				coord2 += 1;
			}
		} else {
			while (coord1 > 0) {
				if ((*reference)[coord1-1] != (*reference)[coord2-1]) break;
				coord1 -= 1;
				coord2 -= 1;
			}
		}
	}
	if (type == INSERTION) {
		if (sequence.size() == 0) throw runtime_error("Variation::canonify is only applicable to insertions if sequence is known");
		assert(coord1 <= reference->size());
		assert(sequence.size() == coord2);
		if (rightmost) {
			// number of positions by which insertion can be shifted to the right
			int shift = 0;
			while (true) {
				if (coord1 + shift == reference->size()) break;
				if (sequence[shift % coord2] != (*reference)[coord1 + shift]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 += shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(j, sequence.size()-j) + sequence.substr(0, j);
		} else {
			// number of positions by which insertion can be shifted to the left
			int shift = 0;
			while (true) {
				if (coord1 - shift == 0) break;
				if (sequence[coord2 - 1 - (shift % coord2)] != (*reference)[coord1 - shift - 1]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 -= shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(sequence.size()-j, j) + sequence.substr(0, sequence.size()-j);
		}
	}
}